

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQClosure::~SQClosure(SQClosure *this)

{
  SQUnsignedInteger SVar1;
  _func_int **pp_Var2;
  SQWeakRef *pSVar3;
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQClosure_00161ff8;
  if (in_RDI[1].super_SQRefCounted._uiRef != 0) {
    SVar1 = in_RDI[1].super_SQRefCounted._uiRef;
    *(long *)(SVar1 + 8) = *(long *)(SVar1 + 8) + -1;
    if (*(long *)(in_RDI[1].super_SQRefCounted._uiRef + 8) == 0) {
      (**(code **)(*(long *)in_RDI[1].super_SQRefCounted._uiRef + 0x10))();
    }
    in_RDI[1].super_SQRefCounted._uiRef = 0;
  }
  if (in_RDI[1].super_SQRefCounted._vptr_SQRefCounted != (_func_int **)0x0) {
    pp_Var2 = in_RDI[1].super_SQRefCounted._vptr_SQRefCounted;
    pp_Var2[1] = pp_Var2[1] + -1;
    if (in_RDI[1].super_SQRefCounted._vptr_SQRefCounted[1] == (_func_int *)0x0) {
      (**(code **)(*in_RDI[1].super_SQRefCounted._vptr_SQRefCounted + 0x10))();
    }
    in_RDI[1].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  }
  if (in_RDI[1].super_SQRefCounted._weakref != (SQWeakRef *)0x0) {
    pSVar3 = in_RDI[1].super_SQRefCounted._weakref;
    (pSVar3->super_SQRefCounted)._uiRef = (pSVar3->super_SQRefCounted)._uiRef - 1;
    if (((in_RDI[1].super_SQRefCounted._weakref)->super_SQRefCounted)._uiRef == 0) {
      (*((in_RDI[1].super_SQRefCounted._weakref)->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    in_RDI[1].super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  }
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  SQCollectable::~SQCollectable((SQCollectable *)0x130e25);
  return;
}

Assistant:

SQClosure::~SQClosure()
{
    __ObjRelease(_root);
    __ObjRelease(_env);
    __ObjRelease(_base);
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}